

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O0

void __thiscall jbcoin::STObject::setFieldVL(STObject *this,SField *field,Blob *v)

{
  uchar *data;
  size_type size;
  Buffer local_30;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_20;
  Blob *v_local;
  SField *field_local;
  STObject *this_local;
  
  local_20 = v;
  v_local = (Blob *)field;
  field_local = (SField *)this;
  data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(v);
  size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_20);
  Buffer::Buffer(&local_30,data,size);
  setFieldUsingSetValue<jbcoin::STBlob,jbcoin::Buffer>(this,field,&local_30);
  Buffer::~Buffer(&local_30);
  return;
}

Assistant:

void STObject::setFieldVL (SField const& field, Blob const& v)
{
    setFieldUsingSetValue <STBlob> (field, Buffer(v.data (), v.size ()));
}